

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalGet(wasm::LocalGet__(void *this,LocalGet *curr)

{
  _Rb_tree_color index;
  int iVar1;
  Function *this_00;
  long lVar2;
  bool bVar3;
  uint uVar4;
  Set *pSVar5;
  Type TVar6;
  Type TVar7;
  _Rb_tree_node_base *p_Var8;
  uint uVar9;
  _Rb_tree_color index_00;
  
  pSVar5 = EquivalentSets::getEquivalents((EquivalentSets *)((long)this + 0x1b0),curr->index);
  if (pSVar5 == (Set *)0x0) {
    return;
  }
  this_00 = *(Function **)((long)this + 200);
  p_Var8 = (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  index_00 = ~_S_red;
joined_r0x00b1fa1e:
  if ((_Rb_tree_header *)p_Var8 == &(pSVar5->_M_t)._M_impl.super__Rb_tree_header) goto LAB_00b1fac8;
  index = p_Var8[1]._M_color;
  if (index_00 != ~_S_red) {
    TVar6 = Function::getLocalType(this_00,index_00);
    TVar7 = Function::getLocalType(this_00,index);
    bVar3 = wasm::Type::isSubType(TVar7,TVar6);
    if (!bVar3) goto LAB_00b1fab4;
    if (TVar7.id != TVar6.id) goto LAB_00b1faab;
    uVar4 = *(uint *)(**(long **)((long)this + 0xe0) + (ulong)index * 4);
    if (curr->index == index) {
      if (uVar4 == 0) goto LAB_00b1fbad;
      uVar4 = uVar4 - 1;
    }
    uVar9 = *(uint *)(**(long **)((long)this + 0xe0) + (ulong)index_00 * 4);
    if (curr->index == index_00) {
      if (uVar9 == 0) goto LAB_00b1fbad;
      uVar9 = uVar9 - 1;
    }
    if (uVar4 <= uVar9) goto LAB_00b1fab4;
  }
LAB_00b1faab:
  index_00 = index;
LAB_00b1fab4:
  p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  goto joined_r0x00b1fa1e;
LAB_00b1fac8:
  if (index_00 == ~_S_red) {
    __assert_fail("best != Index(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x450,
                  "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  TVar6 = Function::getLocalType(this_00,index_00);
  TVar7 = Function::getLocalType(this_00,curr->index);
  if ((index_00 != curr->index) && (bVar3 = wasm::Type::isSubType(TVar6,TVar7), bVar3)) {
    lVar2 = **(long **)((long)this + 0xe0);
    uVar9 = *(uint *)(lVar2 + (ulong)index_00 * 4);
    uVar4 = uVar9;
    if (curr->index == index_00) {
      if (uVar9 == 0) goto LAB_00b1fbad;
      uVar4 = uVar9 - 1;
    }
    iVar1 = *(int *)(lVar2 + (ulong)curr->index * 4);
    if (iVar1 == 0) {
LAB_00b1fbad:
      __assert_fail("ret >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x42e,
                    "auto wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *)::(anonymous class)::operator()(Index) const [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    if ((iVar1 - 1U < uVar4) || (TVar6.id != TVar7.id)) {
      *(uint *)(lVar2 + (ulong)index_00 * 4) = uVar9 + 1;
      iVar1 = *(int *)(lVar2 + (ulong)curr->index * 4);
      if (iVar1 == 0) {
        __assert_fail("(*numLocalGets)[curr->index] >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x45d,
                      "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
      *(int *)(lVar2 + (ulong)curr->index * 4) = iVar1 + -1;
      curr->index = index_00;
      *(undefined1 *)((long)this + 0x1a8) = 1;
      if (TVar6.id != TVar7.id) {
        TVar6 = Function::getLocalType(this_00,index_00);
        (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             TVar6.id;
        *(undefined1 *)((long)this + 0x1a9) = 1;
      }
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }